

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void absl::base_internal::AddToFreelist(void *v,Arena *arena)

{
  AllocList *e;
  int iVar1;
  AllocList *prev [30];
  AllocList *local_118 [31];
  
  e = (AllocList *)((long)v + -0x20);
  if ((*(ulong *)((long)v + -0x18) ^ (ulong)e) != 0x4c833e95) {
    AddToFreelist();
  }
  if (*(Arena **)((long)v + -0x10) != arena) {
    AddToFreelist();
  }
  iVar1 = LLA_SkiplistLevels(*(size_t *)((long)v + -0x20),arena->min_size,&arena->random);
  *(int *)v = iVar1;
  LLA_SkiplistInsert(&arena->freelist,e,local_118);
  *(ulong *)((long)v + -0x18) = (ulong)e ^ 0xffffffffb37cc16a;
  Coalesce(e);
  Coalesce(local_118[0]);
  return;
}

Assistant:

static void AddToFreelist(void *v, LowLevelAlloc::Arena *arena) {
  AllocList *f = reinterpret_cast<AllocList *>(
                        reinterpret_cast<char *>(v) - sizeof (f->header));
  ABSL_RAW_CHECK(f->header.magic == Magic(kMagicAllocated, &f->header),
                 "bad magic number in AddToFreelist()");
  ABSL_RAW_CHECK(f->header.arena == arena,
                 "bad arena pointer in AddToFreelist()");
  f->levels = LLA_SkiplistLevels(f->header.size, arena->min_size,
                                 &arena->random);
  AllocList *prev[kMaxLevel];
  LLA_SkiplistInsert(&arena->freelist, f, prev);
  f->header.magic = Magic(kMagicUnallocated, &f->header);
  Coalesce(f);                  // maybe coalesce with successor
  Coalesce(prev[0]);            // maybe coalesce with predecessor
}